

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O3

void __thiscall CPU::LDX_IM(CPU *this)

{
  byte bVar1;
  int iVar2;
  
  this->cycles = 2;
  iVar2 = (*this->memory->_vptr_MemoryBus[2])(this->memory,(ulong)this->pc);
  this->pc = this->pc + 1;
  this->cycles = this->cycles - 1;
  bVar1 = (byte)iVar2;
  this->X = bVar1;
  (this->field_6).ps = bVar1 & 0x80 | (bVar1 == 0) * '\x02' | (this->field_6).ps & 0x7d;
  return;
}

Assistant:

void CPU::LDX_IM()
{
    cycles = 2;
    X = GetByte();
    Z = (X == 0);
    N = (X & 0b10000000) > 0;
}